

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.h
# Opt level: O1

array<double,_3UL> * __thiscall
Layer::calculate(array<double,_3UL> *__return_storage_ptr__,Layer *this,double h)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_40;
  
  dVar3 = this->L;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar2 = -this->g0 / (this->R * dVar3);
    dVar3 = (h - this->h0) * dVar3 + this->T0;
    dVar1 = this->p0;
    local_40 = pow(dVar3 / this->T0,dVar2);
    local_40 = local_40 * dVar1;
    dVar1 = this->d0;
    dVar2 = pow(dVar3 / this->T0,dVar2 + -1.0);
    dVar2 = dVar2 * dVar1;
  }
  else {
    dVar3 = this->T0;
    dVar1 = this->p0;
    local_40 = exp((h - this->h0) * (-this->g0 / (this->R * dVar3)));
    local_40 = local_40 * dVar1;
    dVar1 = this->d0;
    dVar2 = exp((h - this->h0) * (-this->g0 / (this->R * this->T0)));
    dVar2 = dVar2 * dVar1;
  }
  __return_storage_ptr__->_M_elems[0] = dVar3;
  __return_storage_ptr__->_M_elems[1] = local_40;
  __return_storage_ptr__->_M_elems[2] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

std::array<double, 3> calculate(double h) {
        double T, p, d;

        if (this->L == 0) {
            T = this->T0;
            p = this->p0 * exp(-this->g0 / (this->R * this->T0) * (h - this->h0));
            d = this->d0 * exp(-this->g0 / (this->R * this->T0) * (h - this->h0));
        } else {
            double C = -this->g0 / (this->L * this->R);
            T = this->temperature(h);
            p = this->p0 * pow((T / this->T0), C);
            d = this->d0 * pow((T / this->T0), C - 1);
        }
        std::array<double, 3> values = {T, p, d};
        return values;
    }